

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-type.c
# Opt level: O1

coda_ascii_float_mapping * coda_ascii_float_mapping_new(char *str,double value)

{
  size_t sVar1;
  coda_ascii_float_mapping *__ptr;
  char *pcVar2;
  
  if (str == (char *)0x0) {
    __ptr = (coda_ascii_float_mapping *)0x0;
    coda_set_error(-100,"empty string value (%s:%u)",
                   "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-type.c"
                   ,0x123);
  }
  else {
    sVar1 = strlen(str);
    if (sVar1 < 0x41) {
      __ptr = (coda_ascii_float_mapping *)malloc(0x18);
      if (__ptr == (coda_ascii_float_mapping *)0x0) {
        __ptr = (coda_ascii_float_mapping *)0x0;
        coda_set_error(-1,"out of memory (could not allocate %lu bytes) (%s:%u)",0x18,
                       "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-type.c"
                       ,0x130);
      }
      else {
        __ptr->length = 0;
        __ptr->str = (char *)0x0;
        __ptr->value = value;
        pcVar2 = strdup(str);
        __ptr->str = pcVar2;
        if (pcVar2 == (char *)0x0) {
          coda_set_error(-1,"out of memory (could not duplicate string) (%s:%u)",
                         "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-type.c"
                         ,0x13b);
          free(__ptr);
          __ptr = (coda_ascii_float_mapping *)0x0;
        }
        else {
          sVar1 = strlen(str);
          __ptr->length = (int)sVar1;
        }
      }
    }
    else {
      __ptr = (coda_ascii_float_mapping *)0x0;
      coda_set_error(-400,"string too large (%ld) for ascii float mapping",sVar1);
    }
  }
  return __ptr;
}

Assistant:

coda_ascii_float_mapping *coda_ascii_float_mapping_new(const char *str, double value)
{
    coda_ascii_float_mapping *mapping;

    if (str == NULL)
    {
        coda_set_error(CODA_ERROR_INVALID_ARGUMENT, "empty string value (%s:%u)", __FILE__, __LINE__);
        return NULL;
    }
    if (strlen(str) > MAX_ASCII_NUMBER_LENGTH)
    {
        coda_set_error(CODA_ERROR_DATA_DEFINITION, "string too large (%ld) for ascii float mapping", (long)strlen(str));
        return NULL;
    }

    mapping = (coda_ascii_float_mapping *)malloc(sizeof(coda_ascii_float_mapping));
    if (mapping == NULL)
    {
        coda_set_error(CODA_ERROR_OUT_OF_MEMORY, "out of memory (could not allocate %lu bytes) (%s:%u)",
                       (long)sizeof(coda_ascii_float_mapping), __FILE__, __LINE__);
        return NULL;
    }
    mapping->length = 0;
    mapping->str = NULL;
    mapping->value = value;

    mapping->str = strdup(str);
    if (mapping->str == NULL)
    {
        coda_set_error(CODA_ERROR_OUT_OF_MEMORY, "out of memory (could not duplicate string) (%s:%u)", __FILE__,
                       __LINE__);
        free(mapping);
        return NULL;
    }
    mapping->length = (int)strlen(str);

    return mapping;
}